

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O1

size_t tinyusdz::LZ4Compression::CompressToBuffer
                 (char *input,char *compressed,size_t inputSize,string *err)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int maxOutputSize;
  size_t sVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  char cVar11;
  int *piVar12;
  int *piVar13;
  ulong uVar14;
  string __str_1;
  string __str;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  if (inputSize < 0x3e82000001) {
    if (inputSize < 0x7e000001) {
      *compressed = '\0';
      sVar4 = GetCompressedBufferSize(inputSize);
      iVar3 = LZ4_compress_default(input,compressed + 1,(int)inputSize,(int)sVar4);
      piVar12 = (int *)(compressed + (long)iVar3 + 1);
    }
    else {
      uVar10 = inputSize / 0x7e000000;
      uVar14 = inputSize % 0x7e000000;
      uVar7 = (uVar14 != 0) + uVar10;
      if (uVar7 < 0x80) {
        *compressed = (char)uVar7;
        piVar12 = (int *)(compressed + 1);
        do {
          piVar13 = piVar12;
          iVar3 = LZ4_compressBound(0x7e000000);
          iVar3 = LZ4_compress_default(input,(char *)(piVar13 + 1),0x7e000000,iVar3);
          *piVar13 = iVar3;
          piVar12 = (int *)((long)piVar13 + (long)iVar3 + 4);
          input = input + 0x7e000000;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        if (uVar14 != 0) {
          maxOutputSize = LZ4_compressBound((int)uVar14);
          iVar3 = LZ4_compress_default
                            (input,(char *)((long)piVar13 + (long)iVar3 + 8),(int)uVar14,
                             maxOutputSize);
          *piVar12 = iVar3;
          piVar12 = (int *)((long)piVar12 + (long)iVar3 + 4);
        }
      }
      else {
        piVar12 = (int *)compressed;
        if (err != (string *)0x0) {
          local_d0 = &local_c0;
          ::std::__cxx11::string::_M_construct((ulong)&local_d0,'\x03');
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,(uint)local_c8,0x80);
          plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x43a7c4);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_e0 = *plVar8;
            lStack_d8 = plVar5[3];
            local_f0 = &local_e0;
          }
          else {
            local_e0 = *plVar8;
            local_f0 = (long *)*plVar5;
          }
          local_e8 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)::std::__cxx11::string::append((char *)&local_f0);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_a0 = *plVar8;
            lStack_98 = plVar5[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar8;
            local_b0 = (long *)*plVar5;
          }
          local_a8 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
        }
      }
      if (0x7f < uVar7) {
        return 0;
      }
    }
    return (long)piVar12 - (long)compressed;
  }
  if (err == (string *)0x0) {
    return 0;
  }
  sVar4 = inputSize;
  cVar2 = '\x04';
  do {
    cVar11 = cVar2;
    if (sVar4 < 100) {
      cVar11 = cVar11 + -2;
      goto LAB_0037019b;
    }
    if (sVar4 < 1000) {
      cVar11 = cVar11 + -1;
      goto LAB_0037019b;
    }
    if (sVar4 < 10000) goto LAB_0037019b;
    bVar1 = 99999 < sVar4;
    sVar4 = sVar4 / 10000;
    cVar2 = cVar11 + '\x04';
  } while (bVar1);
  cVar11 = cVar11 + '\x01';
LAB_0037019b:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,inputSize);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x43a778);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_70);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_c0 = *puVar9;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar9;
    local_d0 = (ulong *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,'\f');
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,0x3e82000000);
  uVar7 = CONCAT44(uStack_84,local_88) + local_c8;
  uVar10 = 0xf;
  if (local_d0 != &local_c0) {
    uVar10 = local_c0;
  }
  if (uVar10 < uVar7) {
    uVar10 = 0xf;
    if (local_90 != local_80) {
      uVar10 = local_80[0];
    }
    if (uVar7 <= uVar10) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00370312;
    }
  }
  puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
LAB_00370312:
  local_f0 = &local_e0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = puVar6[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*puVar6;
  }
  local_e8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_f0);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return 0;
}

Assistant:

size_t LZ4Compression::CompressToBuffer(char const *input, char *compressed,
                                        size_t inputSize, std::string *err) {
  if (inputSize > GetMaxInputSize()) {
    if (err) {
      (*err) = "Attempted to compress a buffer of " +
               std::to_string(inputSize) +
               " bytes, "
               "more than the maximum supported " +
               std::to_string(GetMaxInputSize()) + "\n";
    }
    return 0;
  }

  // If it fits in one chunk, just do it.
  char const *const origCompressed = compressed;
  if (inputSize <= LZ4_MAX_INPUT_SIZE) {
    compressed[0] = 0;  // < zero byte means one chunk.
    compressed += 1 + LZ4_compress_default(input, compressed + 1, int(inputSize),
                                           int(GetCompressedBufferSize(inputSize)));
  } else {
    size_t nWholeChunks = inputSize / LZ4_MAX_INPUT_SIZE;
    size_t partChunkSz = inputSize % LZ4_MAX_INPUT_SIZE;
    size_t numChunks = nWholeChunks + (partChunkSz ? 1 : 0);

    if (numChunks > 127) {
      if (err) {
        (*err) = "# of chunks must be less than 127 but got " + std::to_string(numChunks) + "\n";
      }
      return 0;
    }
    *compressed++ = char(numChunks);
    auto writeChunk = [](char const *&_input, char *&_output, size_t size) {
      char *o = _output;
      _output += sizeof(int32_t);
      int32_t n =
          LZ4_compress_default(_input, _output, int(size), LZ4_compressBound(int(size)));
      memcpy(o, &n, sizeof(n));
      _output += n;
      _input += size;
    };
    for (size_t chunk = 0; chunk != nWholeChunks; ++chunk) {
      writeChunk(input, compressed, LZ4_MAX_INPUT_SIZE);
    }
    if (partChunkSz) {
      writeChunk(input, compressed, partChunkSz);
    }
  }

  return size_t(compressed - origCompressed);
}